

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  Mat *this_00;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  float sqrt_var;
  int i;
  Allocator *in_stack_fffffffffffffb28;
  uint7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  int in_stack_fffffffffffffb3c;
  float local_400;
  int local_3fc;
  void *local_3f8;
  int *local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  long *local_3d8;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined8 local_3b8;
  void *local_3b0;
  int *local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  long *local_390;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined8 local_370;
  void *local_368;
  int *local_360;
  undefined8 local_358;
  undefined4 local_350;
  long *local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  void *local_310;
  int *local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  long *local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined8 local_2d0;
  long *local_2c8;
  int local_2b4;
  void **local_2b0;
  void **local_2a0;
  void **local_290;
  void **local_280;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  void **local_260;
  void **local_258;
  int local_250;
  undefined4 local_24c;
  void **local_248;
  void **local_240;
  void **local_238;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  void **local_220;
  void **local_218;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  void **local_200;
  void **local_1f8;
  Allocator *local_1e8;
  Mat *local_1e0;
  long *local_1d8;
  long *local_1d0;
  long *local_1c8;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  Mat *local_18;
  Allocator *local_10;
  
  local_2c8 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_310,in_RSI,*(undefined4 *)(in_RDI + 0xd0),1);
  ppvVar2 = (void **)(in_RDI + 0xd8);
  local_208 = &local_310;
  local_200 = ppvVar2;
  if (ppvVar2 != local_208) {
    if (local_308 != (int *)0x0) {
      local_20c = 1;
      LOCK();
      local_210 = *local_308;
      *local_308 = *local_308 + 1;
      UNLOCK();
    }
    local_148 = ppvVar2;
    if (*(long *)(in_RDI + 0xe0) != 0) {
      piVar1 = *(int **)(in_RDI + 0xe0);
      local_14c = 0xffffffff;
      LOCK();
      local_150 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_150 == 1) {
        if (*(long *)(in_RDI + 0xf8) == 0) {
          local_38 = *ppvVar2;
          if (local_38 != (void *)0x0) {
            free(local_38);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0xf8) + 0x18))(*(long **)(in_RDI + 0xf8),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    *(undefined4 *)(in_RDI + 0xf0) = 0;
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x104) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined8 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0xe0) = 0;
    *ppvVar2 = *local_208;
    *(void **)(in_RDI + 0xe0) = local_208[1];
    *(void **)(in_RDI + 0xe8) = local_208[2];
    *(undefined4 *)(in_RDI + 0xf0) = *(undefined4 *)(local_208 + 3);
    *(void **)(in_RDI + 0xf8) = local_208[4];
    *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_208 + 5);
    *(undefined4 *)(in_RDI + 0x104) = *(undefined4 *)((long)local_208 + 0x2c);
    *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_208 + 6);
    *(undefined4 *)(in_RDI + 0x10c) = *(undefined4 *)((long)local_208 + 0x34);
    *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_208 + 7);
    *(void **)(in_RDI + 0x118) = local_208[8];
  }
  local_2b0 = &local_310;
  local_1f8 = ppvVar2;
  local_98 = local_2b0;
  if (local_308 != (int *)0x0) {
    local_9c = 0xffffffff;
    LOCK();
    local_a0 = *local_308;
    *local_308 = *local_308 + -1;
    UNLOCK();
    if (local_a0 == 1) {
      if (local_2f0 == (long *)0x0) {
        if (local_310 != (void *)0x0) {
          free(local_310);
        }
      }
      else {
        (**(code **)(*local_2f0 + 0x18))(local_2f0,local_310);
      }
    }
  }
  local_310 = (void *)0x0;
  local_300 = 0;
  local_2f8 = 0;
  local_2e8 = 0;
  local_2e4 = 0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_308 = (int *)0x0;
  local_1c8 = (long *)(in_RDI + 0xd8);
  bVar3 = true;
  if (*local_1c8 != 0) {
    bVar3 = *(long *)(in_RDI + 0x118) * (long)*(int *)(in_RDI + 0x110) == 0;
    local_30 = local_1c8;
  }
  if (bVar3) {
    local_2b4 = -100;
  }
  else {
    (**(code **)(*local_2c8 + 0x10))(&local_368,local_2c8,*(undefined4 *)(in_RDI + 0xd0),1);
    ppvVar2 = (void **)(in_RDI + 0x120);
    local_228 = &local_368;
    local_220 = ppvVar2;
    if (ppvVar2 != local_228) {
      if (local_360 != (int *)0x0) {
        local_22c = 1;
        LOCK();
        local_230 = *local_360;
        *local_360 = *local_360 + 1;
        UNLOCK();
      }
      local_138 = ppvVar2;
      if (*(long *)(in_RDI + 0x128) != 0) {
        piVar1 = *(int **)(in_RDI + 0x128);
        local_13c = 0xffffffff;
        LOCK();
        local_140 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_140 == 1) {
          if (*(long *)(in_RDI + 0x140) == 0) {
            local_40 = *ppvVar2;
            if (local_40 != (void *)0x0) {
              free(local_40);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x140) + 0x18))(*(long **)(in_RDI + 0x140),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x130) = 0;
      *(undefined4 *)(in_RDI + 0x138) = 0;
      *(undefined4 *)(in_RDI + 0x148) = 0;
      *(undefined4 *)(in_RDI + 0x14c) = 0;
      *(undefined4 *)(in_RDI + 0x150) = 0;
      *(undefined4 *)(in_RDI + 0x154) = 0;
      *(undefined4 *)(in_RDI + 0x158) = 0;
      *(undefined8 *)(in_RDI + 0x160) = 0;
      *(undefined8 *)(in_RDI + 0x128) = 0;
      *ppvVar2 = *local_228;
      *(void **)(in_RDI + 0x128) = local_228[1];
      *(void **)(in_RDI + 0x130) = local_228[2];
      *(undefined4 *)(in_RDI + 0x138) = *(undefined4 *)(local_228 + 3);
      *(void **)(in_RDI + 0x140) = local_228[4];
      *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_228 + 5);
      *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)((long)local_228 + 0x2c);
      *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_228 + 6);
      *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_228 + 0x34);
      *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_228 + 7);
      *(void **)(in_RDI + 0x160) = local_228[8];
    }
    local_2a0 = &local_368;
    local_218 = ppvVar2;
    local_b8 = local_2a0;
    if (local_360 != (int *)0x0) {
      local_bc = 0xffffffff;
      LOCK();
      local_c0 = *local_360;
      *local_360 = *local_360 + -1;
      UNLOCK();
      if (local_c0 == 1) {
        if (local_348 == (long *)0x0) {
          if (local_368 != (void *)0x0) {
            free(local_368);
          }
        }
        else {
          (**(code **)(*local_348 + 0x18))(local_348,local_368);
        }
      }
    }
    local_368 = (void *)0x0;
    local_358 = 0;
    local_350 = 0;
    local_340 = 0;
    local_33c = 0;
    local_338 = 0;
    local_334 = 0;
    local_330 = 0;
    local_328 = 0;
    local_360 = (int *)0x0;
    local_1d0 = (long *)(in_RDI + 0x120);
    bVar3 = true;
    if (*local_1d0 != 0) {
      bVar3 = *(long *)(in_RDI + 0x160) * (long)*(int *)(in_RDI + 0x158) == 0;
      local_28 = local_1d0;
    }
    if (bVar3) {
      local_2b4 = -100;
    }
    else {
      (**(code **)(*local_2c8 + 0x10))(&local_3b0,local_2c8,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x168);
      local_248 = &local_3b0;
      local_240 = ppvVar2;
      if (ppvVar2 != local_248) {
        if (local_3a8 != (int *)0x0) {
          local_24c = 1;
          LOCK();
          local_250 = *local_3a8;
          *local_3a8 = *local_3a8 + 1;
          UNLOCK();
        }
        local_128 = ppvVar2;
        if (*(long *)(in_RDI + 0x170) != 0) {
          piVar1 = *(int **)(in_RDI + 0x170);
          local_12c = 0xffffffff;
          LOCK();
          local_130 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_130 == 1) {
            if (*(long *)(in_RDI + 0x188) == 0) {
              local_48 = *ppvVar2;
              if (local_48 != (void *)0x0) {
                free(local_48);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
        *(undefined4 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x194) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined8 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x170) = 0;
        *ppvVar2 = *local_248;
        *(void **)(in_RDI + 0x170) = local_248[1];
        *(void **)(in_RDI + 0x178) = local_248[2];
        *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(local_248 + 3);
        *(void **)(in_RDI + 0x188) = local_248[4];
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_248 + 5);
        *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_248 + 0x2c);
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_248 + 6);
        *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_248 + 0x34);
        *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_248 + 7);
        *(void **)(in_RDI + 0x1a8) = local_248[8];
      }
      local_290 = &local_3b0;
      local_238 = ppvVar2;
      local_d8 = local_290;
      if (local_3a8 != (int *)0x0) {
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *local_3a8;
        *local_3a8 = *local_3a8 + -1;
        UNLOCK();
        if (local_e0 == 1) {
          if (local_390 == (long *)0x0) {
            if (local_3b0 != (void *)0x0) {
              free(local_3b0);
            }
          }
          else {
            (**(code **)(*local_390 + 0x18))(local_390,local_3b0);
          }
        }
      }
      local_3b0 = (void *)0x0;
      local_3a0 = 0;
      local_398 = 0;
      local_388 = 0;
      local_384 = 0;
      local_380 = 0;
      local_37c = 0;
      local_378 = 0;
      local_370 = 0;
      local_3a8 = (int *)0x0;
      local_1d8 = (long *)(in_RDI + 0x168);
      bVar3 = true;
      if (*local_1d8 != 0) {
        bVar3 = *(long *)(in_RDI + 0x1a8) * (long)*(int *)(in_RDI + 0x1a0) == 0;
        local_20 = local_1d8;
      }
      if (bVar3) {
        local_2b4 = -100;
      }
      else {
        (**(code **)(*local_2c8 + 0x10))(&local_3f8,local_2c8,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar2 = (void **)(in_RDI + 0x1b0);
        local_268 = &local_3f8;
        local_260 = ppvVar2;
        if (ppvVar2 != local_268) {
          if (local_3f0 != (int *)0x0) {
            local_26c = 1;
            LOCK();
            local_270 = *local_3f0;
            *local_3f0 = *local_3f0 + 1;
            UNLOCK();
          }
          local_118 = ppvVar2;
          if (*(long *)(in_RDI + 0x1b8) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1b8);
            local_11c = 0xffffffff;
            LOCK();
            local_120 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_120 == 1) {
              if (*(long *)(in_RDI + 0x1d0) == 0) {
                local_50 = *ppvVar2;
                if (local_50 != (void *)0x0) {
                  free(local_50);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))
                          (*(long **)(in_RDI + 0x1d0),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1c0) = 0;
          *(undefined4 *)(in_RDI + 0x1c8) = 0;
          *(undefined4 *)(in_RDI + 0x1d8) = 0;
          *(undefined4 *)(in_RDI + 0x1dc) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined4 *)(in_RDI + 0x1e4) = 0;
          *(undefined4 *)(in_RDI + 0x1e8) = 0;
          *(undefined8 *)(in_RDI + 0x1f0) = 0;
          *(undefined8 *)(in_RDI + 0x1b8) = 0;
          *ppvVar2 = *local_268;
          *(void **)(in_RDI + 0x1b8) = local_268[1];
          *(void **)(in_RDI + 0x1c0) = local_268[2];
          *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_268 + 3);
          *(void **)(in_RDI + 0x1d0) = local_268[4];
          *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_268 + 5);
          *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_268 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_268 + 6);
          *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_268 + 0x34);
          *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_268 + 7);
          *(void **)(in_RDI + 0x1f0) = local_268[8];
        }
        local_280 = &local_3f8;
        local_258 = ppvVar2;
        local_f8 = local_280;
        if (local_3f0 != (int *)0x0) {
          local_fc = 0xffffffff;
          LOCK();
          local_100 = *local_3f0;
          *local_3f0 = *local_3f0 + -1;
          UNLOCK();
          if (local_100 == 1) {
            if (local_3d8 == (long *)0x0) {
              if (local_3f8 != (void *)0x0) {
                free(local_3f8);
              }
            }
            else {
              (**(code **)(*local_3d8 + 0x18))(local_3d8,local_3f8);
            }
          }
        }
        local_3f8 = (void *)0x0;
        local_3e8 = 0;
        local_3e0 = 0;
        local_3d0 = 0;
        local_3cc = 0;
        local_3c8 = 0;
        local_3c4 = 0;
        local_3c0 = 0;
        local_3b8 = 0;
        local_3f0 = (int *)0x0;
        this_00 = (Mat *)(in_RDI + 0x1b0);
        bVar3 = true;
        if (this_00->data != (void *)0x0) {
          bVar3 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
          local_18 = this_00;
        }
        if (bVar3) {
          local_2b4 = -100;
        }
        else {
          local_1e0 = this_00;
          Mat::create(this_00,in_stack_fffffffffffffb3c,
                      CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                      in_stack_fffffffffffffb28);
          local_1e8 = (Allocator *)(in_RDI + 0x1f8);
          bVar3 = true;
          if (local_1e8->_vptr_Allocator != (_func_int **)0x0) {
            bVar3 = *(long *)(in_RDI + 0x238) * (long)*(int *)(in_RDI + 0x230) == 0;
            local_10 = local_1e8;
          }
          if (bVar3) {
            local_2b4 = -100;
          }
          else {
            Mat::create(this_00,in_stack_fffffffffffffb3c,(ulong)in_stack_fffffffffffffb30,local_1e8
                       );
            bVar3 = true;
            if (*(long *)(in_RDI + 0x240) != 0) {
              bVar3 = *(long *)(in_RDI + 0x280) * (long)*(int *)(in_RDI + 0x278) == 0;
            }
            if (bVar3) {
              local_2b4 = -100;
            }
            else {
              for (local_3fc = 0; local_3fc < *(int *)(in_RDI + 0xd0); local_3fc = local_3fc + 1) {
                local_400 = SQRT(*(float *)(*(long *)(in_RDI + 0x168) + (long)local_3fc * 4) +
                                 *(float *)(in_RDI + 0xd4));
                if ((local_400 == 0.0) && (!NAN(local_400))) {
                  local_400 = 0.0001;
                }
                *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_3fc * 4) =
                     *(float *)(*(long *)(in_RDI + 0x1b0) + (long)local_3fc * 4) -
                     (*(float *)(*(long *)(in_RDI + 0xd8) + (long)local_3fc * 4) *
                     *(float *)(*(long *)(in_RDI + 0x120) + (long)local_3fc * 4)) / local_400;
                *(float *)(*(long *)(in_RDI + 0x240) + (long)local_3fc * 4) =
                     *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_3fc * 4) / local_400;
              }
              local_2b4 = 0;
            }
          }
        }
      }
    }
  }
  return local_2b4;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i = 0; i < channels; i++)
    {
        float sqrt_var = sqrtf(var_data[i] + eps);
        if (sqrt_var == 0.f)
            sqrt_var = 0.0001f; // sanitize divide by zero
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}